

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_allocator.hpp
# Opt level: O1

void __thiscall
Al::internal::
CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
::CachingAllocator(CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
                   *this)

{
  pointer *ppvVar1;
  iterator __position;
  long lVar2;
  
  (this->free_data).
  super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->free_data).
  super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->free_data).
  super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->alloc_to_bin)._M_h._M_buckets = &(this->alloc_to_bin)._M_h._M_single_bucket;
  (this->alloc_to_bin)._M_h._M_bucket_count = 1;
  (this->alloc_to_bin)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->alloc_to_bin)._M_h._M_element_count = 0;
  (this->alloc_to_bin)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->alloc_to_bin)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->alloc_to_bin)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  lVar2 = 0x3d;
  do {
    __position._M_current =
         (this->free_data).
         super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->free_data).
        super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
      ::_M_realloc_insert<>(&this->free_data,__position);
    }
    else {
      ((__position._M_current)->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppvVar1 = &(this->free_data).
                 super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppvVar1 = *ppvVar1 + 1;
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return;
}

Assistant:

CachingAllocator() {
    for (size_t i = 0; i < bin_sizes.size(); ++i) {
      free_data.emplace_back();
    }
  }